

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTable.cpp
# Opt level: O0

void QTable::Load(string *filename,size_t nrRows,size_t nrColumns,QTable *Q)

{
  double dVar1;
  byte bVar2;
  bool bVar3;
  char *pcVar4;
  ostream *this;
  E *this_00;
  long *plVar5;
  reference pdVar6;
  undefined8 uVar7;
  long in_RDX;
  long in_RSI;
  string *in_RDI;
  istringstream is;
  string buffer;
  bad_alloc *e;
  double q;
  size_t s;
  size_t a;
  ifstream fp;
  size_type in_stack_fffffffffffffb98;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_fffffffffffffba0;
  undefined7 in_stack_fffffffffffffbc8;
  undefined8 in_stack_fffffffffffffbe8;
  undefined1 preserve;
  ostream *in_stack_fffffffffffffbf0;
  ostream *in_stack_fffffffffffffbf8;
  undefined7 in_stack_fffffffffffffc00;
  istringstream local_3f8 [384];
  string local_278 [40];
  double local_250;
  long local_248;
  long local_240;
  long local_228 [66];
  long local_18;
  long local_10;
  string *local_8;
  
  preserve = (undefined1)((ulong)in_stack_fffffffffffffbe8 >> 0x38);
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_228,pcVar4,_S_in);
  bVar2 = std::ios::operator!((ios *)((long)local_228 + *(long *)(local_228[0] + -0x18)));
  if ((bVar2 & 1) != 0) {
    in_stack_fffffffffffffbf8 = std::operator<<((ostream *)&std::cerr,"QTable::Load: failed to ");
    in_stack_fffffffffffffbf0 = std::operator<<(in_stack_fffffffffffffbf8,"open file ");
    this = std::operator<<(in_stack_fffffffffffffbf0,local_8);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    preserve = (undefined1)((ulong)this >> 0x38);
  }
  boost::numeric::ublas::
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::resize((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            *)CONCAT17(bVar2,in_stack_fffffffffffffc00),(size_type)in_stack_fffffffffffffbf8,
           (size_type)in_stack_fffffffffffffbf0,(bool)preserve);
  local_248 = 0;
  std::__cxx11::string::string(local_278);
  while( true ) {
    this_00 = (E *)std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)local_228,local_278);
    bVar2 = std::ios::eof();
    if (((bVar2 ^ 0xff) & 1) == 0) {
      if (local_248 == local_10) {
        std::__cxx11::string::~string(local_278);
        std::ifstream::~ifstream(local_228);
        return;
      }
      uVar7 = __cxa_allocate_exception(0x28);
      E::E(this_00,(char *)CONCAT17(bVar2,in_stack_fffffffffffffbc8));
      __cxa_throw(uVar7,&E::typeinfo,E::~E);
    }
    std::__cxx11::istringstream::istringstream(local_3f8,local_278,_S_in);
    local_240 = 0;
    while( true ) {
      plVar5 = (long *)std::istream::operator>>(local_3f8,&local_250);
      bVar3 = std::ios::operator_cast_to_bool((ios *)((long)plVar5 + *(long *)(*plVar5 + -0x18)));
      dVar1 = local_250;
      if (!bVar3) break;
      local_240 = local_240 + 1;
      pdVar6 = boost::numeric::ublas::
               matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
               ::operator()(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,0x9ffa1f);
      *pdVar6 = dVar1;
    }
    if (local_240 != local_18) break;
    local_248 = local_248 + 1;
    std::__cxx11::istringstream::~istringstream(local_3f8);
  }
  uVar7 = __cxa_allocate_exception(0x28);
  E::E(this_00,(char *)CONCAT17(bVar2,in_stack_fffffffffffffbc8));
  __cxa_throw(uVar7,&E::typeinfo,E::~E);
}

Assistant:

void QTable::Load(const std::string &filename,
                  size_t nrRows,
                  size_t nrColumns,
                  QTable &Q)
{
    ifstream fp(filename.c_str());
    if(!fp)
    {
        cerr << "QTable::Load: failed to "
             << "open file " << filename << endl;            
    }

    size_t a,s;
    double q;

//    QTable Q(nrRows,nrColumns);
    try { 
        Q.resize(nrRows,nrColumns);
    }
    catch(std::bad_alloc &e)
    {
        cout << "QTable::Load ran out of memory resizing QTable" << endl;
        throw(e);
    }

    s=0;
    string buffer;
    while(!getline(fp,buffer).eof())
    {
        istringstream is(buffer);
        a=0;
        while(is >> q)
            Q(s,a++)=q;

        if(a!=nrColumns)
            throw(E("QTable::Load wrong number of columns"));

        s++;
    }
    
    if(s!=nrRows)
        throw(E("QTable::Load wrong number of rows"));
}